

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

char * Cmd_DeriveConvertIntoString(int argc,char **argv)

{
  char *pcVar1;
  int local_40c;
  char local_408 [4];
  int i;
  char pBuffer [1000];
  char **argv_local;
  int argc_local;
  
  memset(local_408,0,1000);
  for (local_40c = 0; local_40c < argc; local_40c = local_40c + 1) {
    strcat(local_408,argv[local_40c]);
    strcat(local_408," ");
  }
  pcVar1 = Abc_UtilStrsav(local_408);
  return pcVar1;
}

Assistant:

char * Cmd_DeriveConvertIntoString( int argc, char ** argv )
{
    char pBuffer[CMD_AUTO_LINE_MAX] = {0};
    int i;
    for ( i = 0; i < argc; i++ )
    {
        strcat( pBuffer, argv[i] );
        strcat( pBuffer, " " );
    }
    return Abc_UtilStrsav(pBuffer);
}